

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O1

Reals Omega_h::repeat_vector<9>(LO n,Vector<9> v)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined8 uVar3;
  long lVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar5;
  int in_ESI;
  Vector<9> *pVVar6;
  undefined4 in_register_0000003c;
  double *pdVar7;
  byte bVar8;
  Reals RVar9;
  Write<double> local_98;
  Write<double> local_80;
  undefined1 local_70 [88];
  
  bVar8 = 0;
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  Write<double>::Write(&local_98,in_ESI * 9,(string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  local_70._0_8_ = local_98.shared_alloc_.alloc;
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_70._0_8_ = (local_98.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70._8_8_ = local_98.shared_alloc_.direct_ptr;
  pVVar6 = &v;
  pdVar7 = (double *)(local_70 + 0x10);
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pdVar7 = (pVVar6->super_Few<double,_9>).array_[0];
    pVVar6 = (Vector<9> *)((long)pVVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    pdVar7 = pdVar7 + (ulong)bVar8 * -2 + 1;
  }
  parallel_for<Omega_h::repeat_vector<9>(int,Omega_h::Vector<9>)::_lambda(int)_1_>
            (in_ESI,(type_conflict4 *)local_70,"repeat_vector");
  local_80.shared_alloc_.alloc = local_98.shared_alloc_.alloc;
  local_80.shared_alloc_.direct_ptr = local_98.shared_alloc_.direct_ptr;
  if ((((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
       local_98.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + -1;
    local_80.shared_alloc_.alloc = (Alloc *)((local_98.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_98.shared_alloc_.alloc = (Alloc *)0x0;
  local_98.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)CONCAT44(in_register_0000003c,n),&local_80);
  pAVar2 = local_80.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 && local_80.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_80.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  uVar3 = local_70._0_8_;
  if ((local_70._0_8_ & 7) == 0 && (Alloc *)local_70._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_70._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_70._0_8_);
      operator_delete((void *)uVar3,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  pAVar2 = local_98.shared_alloc_.alloc;
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_98.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)CONCAT44(in_register_0000003c,n);
  return (Reals)RVar9.write_.shared_alloc_;
}

Assistant:

Reals repeat_vector(LO n, Vector<dim> v) {
  Write<Real> vs(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) { set_vector(vs, i, v); };
  parallel_for(n, f, "repeat_vector");
  return vs;
}